

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O2

S2Cap * __thiscall S2Cap::Complement(S2Cap *__return_storage_ptr__,S2Cap *this)

{
  double dVar1;
  S1ChordAngle radius;
  S2Point local_28;
  
  dVar1 = (this->radius_).length2_;
  if ((dVar1 != 4.0) || (NAN(dVar1))) {
    if (0.0 <= dVar1) {
      local_28.c_[2] = -(this->center_).c_[2];
      local_28.c_[0]._0_4_ = *(undefined4 *)(this->center_).c_;
      local_28.c_[1]._0_4_ = *(undefined4 *)((this->center_).c_ + 1);
      local_28.c_[0]._4_4_ = *(uint *)((long)(this->center_).c_ + 4) ^ 0x80000000;
      local_28.c_[1]._4_4_ = *(uint *)((long)(this->center_).c_ + 0xc) ^ 0x80000000;
      radius = S1ChordAngle::FromLength2(4.0 - dVar1);
      S2Cap(__return_storage_ptr__,&local_28,radius);
    }
    else {
      Full();
    }
  }
  else {
    S2Cap(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cap::Complement() const {
  // The complement of a full cap is an empty cap, not a singleton.
  // Also make sure that the complement of an empty cap is full.
  if (is_full()) return Empty();
  if (is_empty()) return Full();
  return S2Cap(-center_, S1ChordAngle::FromLength2(4 - radius_.length2()));
}